

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

void Abc_CollectTopOr(Abc_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  void **ppvVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  vSuper->nSize = 0;
  if (((ulong)pObj & 1) == 0) {
    iVar3 = 0;
    ppvVar1 = vSuper->pArray;
    if (vSuper->nCap == 0) {
      if (ppvVar1 == (void **)0x0) {
        ppvVar1 = (void **)malloc(0x80);
        iVar3 = 0;
      }
      else {
        ppvVar1 = (void **)realloc(ppvVar1,0x80);
        iVar3 = vSuper->nSize;
      }
      vSuper->pArray = ppvVar1;
      vSuper->nCap = 0x10;
    }
    vSuper->nSize = iVar3 + 1;
    ppvVar1[iVar3] = (void *)((ulong)pObj | 1);
  }
  else {
    Abc_CollectTopOr_rec((Abc_Obj_t *)((ulong)pObj & 0xfffffffffffffffe),vSuper);
    if (1 < (long)vSuper->nSize) {
      qsort(vSuper->pArray,(long)vSuper->nSize,8,Abc_ObjCompareById);
      iVar3 = vSuper->nSize;
      iVar2 = 1;
      if (1 < (long)iVar3) {
        lVar4 = 1;
        do {
          ppvVar1 = vSuper->pArray;
          if (ppvVar1[lVar4] != ppvVar1[lVar4 + -1]) {
            lVar5 = (long)iVar2;
            iVar2 = iVar2 + 1;
            ppvVar1[lVar5] = ppvVar1[lVar4];
          }
          lVar4 = lVar4 + 1;
        } while (iVar3 != lVar4);
      }
      vSuper->nSize = iVar2;
    }
  }
  return;
}

Assistant:

void Abc_CollectTopOr( Abc_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    Vec_PtrClear( vSuper );
    if ( Abc_ObjIsComplement(pObj) )
    {
        Abc_CollectTopOr_rec( Abc_ObjNot(pObj), vSuper );
        Vec_PtrUniqify( vSuper, (int (*)())Abc_ObjCompareById );
    }
    else
        Vec_PtrPush( vSuper, Abc_ObjNot(pObj) );
}